

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

Scl_Tree_t * Scl_LibertyParse(char *pFileName,int fVerbose)

{
  int iVar1;
  Scl_Tree_t *p;
  abctime aVar2;
  abctime time;
  char *pcVar3;
  char *pPos;
  char *local_28;
  
  p = Scl_LibertyStart(pFileName);
  if (p != (Scl_Tree_t *)0x0) {
    local_28 = p->pContents;
    pcVar3 = local_28 + p->nContents;
    Scl_LibertyWipeOutComments(local_28,pcVar3);
    iVar1 = Scl_LibertyBuildItem(p,&local_28,pcVar3);
    if (iVar1 == 0) {
      if (fVerbose == 0) {
        return p;
      }
      pcVar3 = "Parsing finished successfully.  ";
    }
    else {
      pcVar3 = "Parsing failed.  ";
      if (p->pError != (char *)0x0) {
        printf("%s");
      }
    }
    printf(pcVar3);
    aVar2 = Abc_Clock();
    Abc_PrintTime(0x6e97e8,(char *)(aVar2 - p->clkStart),time);
  }
  return p;
}

Assistant:

Scl_Tree_t * Scl_LibertyParse( char * pFileName, int fVerbose )
{
    Scl_Tree_t * p;
    char * pPos;
    if ( (p = Scl_LibertyStart(pFileName)) == NULL )
        return NULL;
    pPos = p->pContents;
    Scl_LibertyWipeOutComments( p->pContents, p->pContents+p->nContents );
    if ( !Scl_LibertyBuildItem( p, &pPos, p->pContents + p->nContents ) == 0 )
    {
        if ( p->pError ) printf( "%s", p->pError );
        printf( "Parsing failed.  " );
        Abc_PrintTime( 1, "Parsing time", Abc_Clock() - p->clkStart );
    }
    else if ( fVerbose )
    {
        printf( "Parsing finished successfully.  " );
        Abc_PrintTime( 1, "Parsing time", Abc_Clock() - p->clkStart );
    }
    return p;
}